

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

DWORD __thiscall TSparseArray::GetItemValueAt(TSparseArray *this,size_t index)

{
  uint uVar1;
  DWORD DVar2;
  DWORD DVar3;
  _BASEVALS *p_Var4;
  uint *puVar5;
  
  p_Var4 = TGenericArray<_BASEVALS>::operator[](&this->BaseVals,index >> 9);
  DVar2 = p_Var4->BaseValue200;
  switch((uint)(index >> 6) & 7) {
  case 0:
    goto switchD_00117161_caseD_0;
  case 1:
    uVar1 = *(uint *)&p_Var4->field_0x4 & 0x7f;
    break;
  case 2:
    uVar1 = *(uint *)&p_Var4->field_0x4 >> 7;
    goto LAB_00117181;
  case 3:
    uVar1 = *(uint *)&p_Var4->field_0x4 >> 0xf;
LAB_00117181:
    uVar1 = uVar1 & 0xff;
    break;
  case 4:
    uVar1 = *(uint *)&p_Var4->field_0x4 >> 0x17;
    break;
  case 5:
    DVar2 = DVar2 + (*(uint *)&p_Var4->field_0x8 & 0x1ff);
    goto switchD_00117161_caseD_0;
  case 6:
    uVar1 = (uint)((ulong)*(undefined8 *)&p_Var4->field_0x4 >> 0x29);
    goto LAB_001171a8;
  case 7:
    uVar1 = (uint)((ulong)*(undefined8 *)&p_Var4->field_0x4 >> 0x32);
LAB_001171a8:
    DVar2 = (uVar1 & 0x1ff) + DVar2;
    goto switchD_00117161_caseD_0;
  }
  DVar2 = DVar2 + uVar1;
switchD_00117161_caseD_0:
  if ((index & 0x20) != 0) {
    puVar5 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,(index >> 5) - 1);
    DVar3 = GetNumberOfSetBits32(*puVar5);
    DVar2 = DVar2 + DVar3;
  }
  puVar5 = TGenericArray<unsigned_int>::operator[](&this->ItemBits,index >> 5);
  DVar3 = GetNumberOfSetBits32(~(-1 << ((byte)index & 0x1f)) & *puVar5);
  return DVar3 + DVar2;
}

Assistant:

DWORD GetItemValueAt(size_t index)
    {
        BASEVALS & SetBitsCount = BaseVals[index >> 0x09];
        DWORD IntValue;
        DWORD BitMask;

        //
        // Since we don't want to count bits for the entire array,
        // there are item value shortcuts every 0x200 items,
        // and then every 0x40 items above the 0x200 base
        //

        // 1) We have base value for every 0x200-th item
        IntValue = SetBitsCount.BaseValue200;

        // 2) Add the base value for each 0x40-th item above the 0x200 base
        switch(((index >> 0x06) & 0x07) - 1)
        {
            case 0:     // Add the 1st value (7 bits)
                IntValue += SetBitsCount.AddValue40;
                break;

            case 1:     // Add the 2nd value (8 bits)
                IntValue += SetBitsCount.AddValue80;
                break;

            case 2:     // Add the 3rd value (8 bits)
                IntValue += SetBitsCount.AddValueC0;
                break;

            case 3:     // Add the 4th value (9 bits)
                IntValue += SetBitsCount.AddValue100;
                break;

            case 4:     // Add the 5th value (9 bits)
                IntValue += SetBitsCount.AddValue140;
                break;

            case 5:     // Add the 6th value (9 bits)
                IntValue += SetBitsCount.AddValue180;
                break;

            case 6:     // Add the 7th value (9 bits)
                IntValue += SetBitsCount.AddValue1C0;
                break;
        }

        // 3) Count the bits of the higher DWORD, if the index 0x20 - 0x30 above the 0x200 base
        if(index & 0x20)
            IntValue += GetNumberOfSetBits32(ItemBits[(index >> 0x05) - 1]);

        // 4) Count the bits in the current DWORD (masked by bit index mask) 
        BitMask = (1 << (index & 0x1F)) - 1;
        return IntValue + GetNumberOfSetBits32(ItemBits[index >> 0x05] & BitMask);
    }